

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

void ffxmsg(int action,char *errmsg)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  
  pcVar8 = ffxmsg::txtbuff[0];
  pcVar2 = ffxmsg::msgptr;
  switch(action) {
  case 1:
    uVar5 = 0;
    uVar6 = (ulong)(uint)ffxmsg::nummsg;
    if (ffxmsg::nummsg < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 * 8 != uVar5; uVar5 = uVar5 + 8) {
      **(undefined1 **)((long)ffxmsg::txtbuff + uVar5) = 0;
    }
    ffxmsg::nummsg = 0;
    pcVar2 = ffxmsg::msgptr;
    break;
  case 2:
    uVar5 = (ulong)ffxmsg::nummsg;
    if ((long)uVar5 < 1) {
      return;
    }
    do {
      uVar6 = uVar5 - 1;
      cVar1 = **(char **)(&DAT_002f9388 + uVar5 * 8);
      **(char **)(&DAT_002f9388 + uVar5 * 8) = '\0';
      if (uVar5 < 2) break;
      uVar5 = uVar6;
    } while (cVar1 != '\x1b');
    goto LAB_00133c59;
  case 3:
    if (0 < ffxmsg::nummsg) {
      ffxmsg::nummsg = ffxmsg::nummsg - 1;
      *ffxmsg::txtbuff[(uint)ffxmsg::nummsg] = '\0';
      pcVar2 = ffxmsg::msgptr;
    }
    break;
  case 4:
    lVar7 = (long)ffxmsg::nummsg;
    do {
      pcVar8 = ffxmsg::txtbuff[0];
      if (lVar7 < 1) {
        *errmsg = '\0';
        return;
      }
      strcpy(errmsg,ffxmsg::txtbuff[0]);
      *pcVar8 = '\0';
      lVar7 = lVar7 + -1;
      ffxmsg::nummsg = (int)lVar7;
      for (lVar4 = 0; lVar4 < lVar7; lVar4 = lVar4 + 1) {
        ffxmsg::txtbuff[lVar4] = ffxmsg::txtbuff[lVar4 + 1];
      }
      pcVar2 = ffxmsg::msgptr;
    } while (*errmsg == '\x1b');
    break;
  case 5:
    iVar10 = ffxmsg::nummsg;
    for (; pcVar8 = ffxmsg::txtbuff[0], pcVar2 = errmsg, *errmsg != '\0'; errmsg = errmsg + sVar3) {
      if (iVar10 == 0x19) {
        ffxmsg::tmpbuff = ffxmsg::txtbuff[0];
        *ffxmsg::txtbuff[0] = '\0';
        for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
          *(char **)(&DAT_002f9388 + lVar7 * 8) = ffxmsg::txtbuff[lVar7];
        }
        ffxmsg::txtbuff[0x18] = pcVar8;
        iVar10 = 0x18;
      }
      else {
        lVar7 = 0;
        do {
          lVar4 = lVar7;
          if (lVar4 + 0x51 == 0x83a) {
            pcVar8 = ffxmsg::txtbuff[iVar10];
            goto LAB_00133aca;
          }
          lVar7 = lVar4 + 0x51;
        } while (ffxmsg::errbuff[0][lVar4] != '\0');
        pcVar8 = ffxmsg::errbuff[0] + lVar4;
        ffxmsg::txtbuff[iVar10] = pcVar8;
      }
LAB_00133aca:
      strncat(pcVar8,errmsg,0x50);
      iVar10 = iVar10 + 1;
      ffxmsg::nummsg = iVar10;
      sVar3 = strlen(errmsg);
      if (0x4f < sVar3) {
        sVar3 = 0x50;
      }
    }
    break;
  case 6:
    lVar7 = (long)ffxmsg::nummsg;
    if (lVar7 == 0x19) {
      ffxmsg::tmpbuff = ffxmsg::txtbuff[0];
      *ffxmsg::txtbuff[0] = '\0';
      for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
        *(char **)(&DAT_002f9388 + lVar7 * 8) = ffxmsg::txtbuff[lVar7];
      }
      ffxmsg::txtbuff[0x18] = pcVar8;
      ffxmsg::nummsg = 0x18;
    }
    else {
      lVar4 = 0;
      do {
        lVar9 = lVar4;
        if (lVar9 + 0x51 == 0x83a) {
          pcVar8 = ffxmsg::txtbuff[lVar7];
          goto LAB_00133c52;
        }
        lVar4 = lVar9 + 0x51;
      } while (ffxmsg::errbuff[0][lVar9] != '\0');
      pcVar8 = ffxmsg::errbuff[0] + lVar9;
      ffxmsg::txtbuff[lVar7] = pcVar8;
    }
LAB_00133c52:
    pcVar8[0] = '\x1b';
    pcVar8[1] = '\0';
    uVar6 = (ulong)(ffxmsg::nummsg + 1);
LAB_00133c59:
    ffxmsg::nummsg = (int)uVar6;
    pcVar2 = ffxmsg::msgptr;
  }
  ffxmsg::msgptr = pcVar2;
  return;
}

Assistant:

void ffxmsg( int action,
            char *errmsg)
/*
  general routine to get, put, or clear the error message stack.
  Use a static array rather than allocating memory as needed for
  the error messages because it is likely to be more efficient
  and simpler to implement.

  Action Code:
DelAll     1  delete all messages on the error stack 
DelMark    2  delete messages back to and including the 1st marker 
DelNewest  3  delete the newest message from the stack 
GetMesg    4  pop and return oldest message, ignoring marks 
PutMesg    5  add a new message to the stack 
PutMark    6  add a marker to the stack 

*/
{
    int ii;
    char markflag;
    static char *txtbuff[errmsgsiz], *tmpbuff, *msgptr;
    static char errbuff[errmsgsiz][81];  /* initialize all = \0 */
    static int nummsg = 0;

    FFLOCK;
    
    if (action == DelAll)  /* clear the whole message stack */
    {
      for (ii = 0; ii < nummsg; ii ++)
        *txtbuff[ii] = '\0';

      nummsg = 0;
    }
    else if (action == DelMark)  /* clear up to and including first marker */
    {
      while (nummsg > 0) {
        nummsg--;  
        markflag = *txtbuff[nummsg]; /* store possible marker character */
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */

        if (markflag == ESMARKER)
           break;   /* found a marker, so quit */
      }
    }
    else if (action == DelNewest)  /* remove newest message from stack */ 
    {
      if (nummsg > 0)
      {
        nummsg--;  
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */
      }
    }
    else if (action == GetMesg)  /* pop and return oldest message from stack */ 
    {                            /* ignoring markers */
      while (nummsg > 0)
      {
         strcpy(errmsg, txtbuff[0]);   /* copy oldest message to output */

         *txtbuff[0] = '\0';  /* clear the buffer for this msg */
           
         nummsg--;  
         for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1]; /* shift remaining pointers */

         if (errmsg[0] != ESMARKER) {   /* quit if this is not a marker */
            FFUNLOCK;
            return;
         }
       }
       errmsg[0] = '\0';  /*  no messages in the stack */
    }
    else if (action == PutMesg)  /* add new message to stack */
    {
     msgptr = errmsg;
     while (strlen(msgptr))
     {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      strncat(txtbuff[nummsg], msgptr, 80);
      nummsg++;

      msgptr += minvalue(80, strlen(msgptr));
     }
    }
    else if (action == PutMark)  /* put a marker on the stack */
    {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      *txtbuff[nummsg] = ESMARKER;      /* write the marker */
      *(txtbuff[nummsg] + 1) = '\0';
      nummsg++;

    }

    FFUNLOCK;
    return;
}